

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O1

sizes xor16(size_t n)

{
  void *pvVar1;
  ulong *puVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  size_t __size;
  size_t capacity;
  void *__ptr;
  uint64_t *keys;
  void *__s;
  void *__ptr_00;
  void *__ptr_01;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  undefined4 *puVar21;
  ushort uVar22;
  uint32_t r0;
  uint uVar23;
  void *pvVar24;
  long lVar25;
  size_t sVar26;
  size_t sVar27;
  ulong uVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  sizes sVar33;
  ulong local_b8;
  ulong local_88;
  
  dVar29 = (double)(n & 0xffffffff) * 1.23 + 32.0;
  uVar8 = (ulong)dVar29;
  uVar8 = (long)(dVar29 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8;
  uVar8 = uVar8 / 3;
  __ptr = malloc((SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) * 3);
  if (__ptr == (void *)0x0) {
    uVar8 = 0;
  }
  if (__ptr == (void *)0x0) {
    puts("allocation failed");
    sVar27 = 0;
    sVar26 = 0;
    goto LAB_0010291e;
  }
  keys = (uint64_t *)malloc(n * 8);
  auVar4 = _DAT_00104060;
  if (n != 0) {
    lVar25 = n - 1;
    auVar30._8_4_ = (int)lVar25;
    auVar30._0_8_ = lVar25;
    auVar30._12_4_ = (int)((ulong)lVar25 >> 0x20);
    uVar9 = 0;
    auVar30 = auVar30 ^ _DAT_00104060;
    auVar31 = _DAT_00104050;
    do {
      auVar32 = auVar31 ^ auVar4;
      if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                  auVar30._4_4_ < auVar32._4_4_) & 1)) {
        keys[uVar9] = uVar9;
      }
      if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
          auVar32._12_4_ <= auVar30._12_4_) {
        keys[uVar9 + 1] = uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar25 = auVar31._8_8_;
      auVar31._0_8_ = auVar31._0_8_ + 2;
      auVar31._8_8_ = lVar25 + 2;
    } while ((n + 1 & 0xfffffffffffffffe) != uVar9);
  }
  if ((int)n == 0) {
LAB_001028a6:
    puts("populating failed");
  }
  else {
    lVar25 = uVar8 * 0x10;
    __size = uVar8 * 0x30;
    __s = malloc(__size);
    __ptr_00 = malloc(__size);
    __ptr_01 = malloc((n & 0xffffffff) << 4);
    if (__ptr_01 == (void *)0x0 || (__ptr_00 == (void *)0x0 || __s == (void *)0x0)) {
LAB_00102887:
      free(__s);
      free(__ptr_00);
      free(__ptr_01);
      goto LAB_001028a6;
    }
    lVar5 = uVar8 * 0x20;
    uVar28 = uVar8 & 0xffffffff;
    local_88 = 0x9e3779b97f4a7c16;
    uVar6 = 0x910a2dec89025cc1;
    local_b8 = n;
    iVar7 = 0;
    while( true ) {
      if (iVar7 + 1 == 10) {
        local_b8 = xor_sort_and_remove_dup(keys,local_b8 & 0xffffffff);
      }
      if (iVar7 == 100) goto LAB_00102887;
      memset(__s,0,__size);
      uVar10 = local_b8 & 0xffffffff;
      if ((int)local_b8 != 0) {
        uVar11 = 0;
        do {
          uVar16 = (keys[uVar11] + uVar6 >> 0x21 ^ keys[uVar11] + uVar6) * -0xae502812aa7333;
          uVar18 = (uVar16 >> 0x21 ^ uVar16) * -0x3b314601e57a13ad;
          uVar16 = uVar18 >> 0x21 ^ uVar18;
          uVar20 = (uVar16 & 0xffffffff) * uVar28 >> 0x1c & 0xfffffffffffffff0;
          puVar2 = (ulong *)((long)__s + uVar20);
          *puVar2 = *puVar2 ^ uVar16;
          piVar13 = (int *)((long)__s + uVar20 + 8);
          *piVar13 = *piVar13 + 1;
          uVar18 = ((uint)(uVar16 << 0x15) | (uint)(uVar18 >> 0x2b)) * uVar28 >> 0x1c &
                   0xfffffffffffffff0;
          puVar2 = (ulong *)((long)__s + uVar18 + lVar25);
          *puVar2 = *puVar2 ^ uVar16;
          piVar13 = (int *)((long)__s + uVar18 + lVar25 + 8);
          *piVar13 = *piVar13 + 1;
          uVar18 = (uVar16 >> 0x16 & 0xffffffff) * uVar28 >> 0x1c & 0xfffffffffffffff0;
          puVar2 = (ulong *)((long)__s + uVar18 + lVar5);
          *puVar2 = *puVar2 ^ uVar16;
          piVar13 = (int *)((long)__s + uVar18 + lVar5 + 8);
          *piVar13 = *piVar13 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      if (uVar8 == 0) {
        lVar12 = 0;
      }
      else {
        lVar12 = 0;
        uVar6 = 0;
        piVar13 = (int *)((long)__s + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr_00 + lVar12 * 0x10 + 8) = (int)uVar6;
            *(undefined8 *)((long)__ptr_00 + lVar12 * 0x10) = *(undefined8 *)(piVar13 + -2);
            lVar12 = lVar12 + 1;
          }
          uVar6 = uVar6 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar8 != uVar6);
      }
      if (uVar8 == 0) {
        lVar14 = 0;
      }
      else {
        lVar14 = 0;
        uVar6 = 0;
        piVar13 = (int *)((long)__s + lVar25 + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr_00 + lVar14 * 0x10 + lVar25 + 8) = (int)uVar6;
            *(undefined8 *)((long)__ptr_00 + lVar14 * 0x10 + lVar25) = *(undefined8 *)(piVar13 + -2)
            ;
            lVar14 = lVar14 + 1;
          }
          uVar6 = uVar6 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar8 != uVar6);
      }
      if (uVar8 == 0) {
        lVar19 = 0;
      }
      else {
        lVar19 = 0;
        uVar6 = 0;
        piVar13 = (int *)((long)__s + lVar5 + 8);
        do {
          if (*piVar13 == 1) {
            *(int *)((long)__ptr_00 + lVar19 * 0x10 + lVar5 + 8) = (int)uVar6;
            *(undefined8 *)((long)__ptr_00 + lVar19 * 0x10 + lVar5) = *(undefined8 *)(piVar13 + -2);
            lVar19 = lVar19 + 1;
          }
          uVar6 = uVar6 + 1;
          piVar13 = piVar13 + 4;
        } while (uVar8 != uVar6);
      }
      uVar6 = 0;
      lVar17 = lVar14 + lVar12 + lVar19;
      while (lVar17 != 0) {
        if (lVar12 != 0) {
          puVar21 = (undefined4 *)((long)__ptr_00 + lVar12 * 0x10 + -4);
          do {
            uVar23 = puVar21[-1];
            if (*(int *)((long)__s + (ulong)uVar23 * 0x10 + 8) != 0) {
              uVar11 = *(ulong *)(puVar21 + -3);
              uVar3 = *puVar21;
              uVar16 = ((uint)(uVar11 << 0x15) | (uint)(uVar11 >> 0x2b)) * uVar28;
              lVar17 = uVar6 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar17) = uVar11;
              *(uint *)((long)__ptr_01 + lVar17 + 8) = uVar23;
              *(undefined4 *)((long)__ptr_01 + lVar17 + 0xc) = uVar3;
              lVar17 = (uVar16 >> 0x20) * 0x10;
              uVar18 = *(ulong *)((long)__s + lVar17 + lVar25) ^ uVar11;
              *(ulong *)((long)__s + lVar17 + lVar25) = uVar18;
              iVar15 = *(int *)((long)__s + lVar17 + lVar25 + 8) + -1;
              *(int *)((long)__s + lVar17 + lVar25 + 8) = iVar15;
              if (iVar15 == 1) {
                *(int *)((long)__ptr_00 + lVar14 * 0x10 + lVar25 + 8) = (int)(uVar16 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar14 * 0x10 + lVar25) = uVar18;
                lVar14 = lVar14 + 1;
              }
              uVar16 = (uVar11 >> 0x16 & 0xffffffff) * uVar28;
              uVar6 = uVar6 + 1;
              lVar17 = (uVar16 >> 0x20) * 0x10;
              uVar11 = uVar11 ^ *(ulong *)((long)__s + lVar17 + lVar5);
              *(ulong *)((long)__s + lVar17 + lVar5) = uVar11;
              iVar15 = *(int *)((long)__s + lVar17 + lVar5 + 8) + -1;
              *(int *)((long)__s + lVar17 + lVar5 + 8) = iVar15;
              if (iVar15 == 1) {
                *(int *)((long)__ptr_00 + lVar19 * 0x10 + lVar5 + 8) = (int)(uVar16 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar19 * 0x10 + lVar5) = uVar11;
                lVar19 = lVar19 + 1;
              }
            }
            lVar12 = lVar12 + -1;
            puVar21 = puVar21 + -4;
          } while (lVar12 != 0);
        }
        if (lVar14 == 0) {
          lVar12 = 0;
        }
        else {
          puVar21 = (undefined4 *)((long)__ptr_00 + lVar14 * 0x10 + lVar25 + -4);
          lVar12 = 0;
          do {
            uVar23 = puVar21[-1];
            if (*(int *)((long)__s + (ulong)uVar23 * 0x10 + lVar25 + 8) != 0) {
              uVar11 = *(ulong *)(puVar21 + -3);
              uVar3 = *puVar21;
              uVar16 = (uVar11 & 0xffffffff) * uVar28;
              lVar17 = uVar6 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar17) = uVar11;
              *(uint *)((long)__ptr_01 + lVar17 + 8) = uVar23 + (int)uVar8;
              *(undefined4 *)((long)__ptr_01 + lVar17 + 0xc) = uVar3;
              lVar17 = (uVar16 >> 0x20) * 0x10;
              uVar18 = *(ulong *)((long)__s + lVar17) ^ uVar11;
              *(ulong *)((long)__s + lVar17) = uVar18;
              iVar15 = *(int *)((long)__s + lVar17 + 8) + -1;
              *(int *)((long)__s + lVar17 + 8) = iVar15;
              if (iVar15 == 1) {
                *(int *)((long)__ptr_00 + lVar12 * 0x10 + 8) = (int)(uVar16 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar12 * 0x10) = uVar18;
                lVar12 = lVar12 + 1;
              }
              uVar16 = (uVar11 >> 0x16 & 0xffffffff) * uVar28;
              uVar6 = uVar6 + 1;
              lVar17 = (uVar16 >> 0x20) * 0x10;
              uVar11 = uVar11 ^ *(ulong *)((long)__s + lVar17 + lVar5);
              *(ulong *)((long)__s + lVar17 + lVar5) = uVar11;
              iVar15 = *(int *)((long)__s + lVar17 + lVar5 + 8) + -1;
              *(int *)((long)__s + lVar17 + lVar5 + 8) = iVar15;
              if (iVar15 == 1) {
                *(int *)((long)__ptr_00 + lVar19 * 0x10 + lVar5 + 8) = (int)(uVar16 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar19 * 0x10 + lVar5) = uVar11;
                lVar19 = lVar19 + 1;
              }
            }
            lVar14 = lVar14 + -1;
            puVar21 = puVar21 + -4;
          } while (lVar14 != 0);
        }
        if (lVar19 == 0) {
          lVar14 = 0;
        }
        else {
          puVar21 = (undefined4 *)((long)__ptr_00 + lVar19 * 0x10 + lVar5 + -4);
          lVar14 = 0;
          do {
            uVar23 = puVar21[-1];
            if (*(int *)((long)__s + (ulong)uVar23 * 0x10 + lVar5 + 8) != 0) {
              uVar11 = *(ulong *)(puVar21 + -3);
              uVar3 = *puVar21;
              uVar16 = (uVar11 & 0xffffffff) * uVar28;
              lVar17 = uVar6 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar17) = uVar11;
              *(uint *)((long)__ptr_01 + lVar17 + 8) = uVar23 + (int)uVar8 * 2;
              *(undefined4 *)((long)__ptr_01 + lVar17 + 0xc) = uVar3;
              lVar17 = (uVar16 >> 0x20) * 0x10;
              uVar18 = *(ulong *)((long)__s + lVar17) ^ uVar11;
              *(ulong *)((long)__s + lVar17) = uVar18;
              iVar15 = *(int *)((long)__s + lVar17 + 8) + -1;
              *(int *)((long)__s + lVar17 + 8) = iVar15;
              if (iVar15 == 1) {
                *(int *)((long)__ptr_00 + lVar12 * 0x10 + 8) = (int)(uVar16 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar12 * 0x10) = uVar18;
                lVar12 = lVar12 + 1;
              }
              uVar16 = ((uint)(uVar11 << 0x15) | (uint)(uVar11 >> 0x2b)) * uVar28;
              uVar6 = uVar6 + 1;
              lVar17 = (uVar16 >> 0x20) * 0x10;
              uVar11 = uVar11 ^ *(ulong *)((long)__s + lVar17 + lVar25);
              *(ulong *)((long)__s + lVar17 + lVar25) = uVar11;
              iVar15 = *(int *)((long)__s + lVar17 + lVar25 + 8) + -1;
              *(int *)((long)__s + lVar17 + lVar25 + 8) = iVar15;
              if (iVar15 == 1) {
                *(int *)((long)__ptr_00 + lVar14 * 0x10 + lVar25 + 8) = (int)(uVar16 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar14 * 0x10 + lVar25) = uVar11;
                lVar14 = lVar14 + 1;
              }
            }
            lVar19 = lVar19 + -1;
            puVar21 = puVar21 + -4;
          } while (lVar19 != 0);
        }
        lVar19 = 0;
        lVar17 = lVar12 + lVar14;
      }
      if (uVar6 == uVar10) break;
      local_88 = local_88 + 0x9e3779b97f4a7c15;
      uVar6 = (local_88 >> 0x1e ^ local_88) * -0x40a7b892e31b1a47;
      uVar6 = (uVar6 >> 0x1b ^ uVar6) * -0x6b2fb644ecceee15;
      uVar6 = uVar6 >> 0x1f ^ uVar6;
      iVar7 = iVar7 + 1;
    }
    if ((int)local_b8 != 0) {
      pvVar1 = (void *)((long)__ptr + uVar8 * 2);
      uVar6 = uVar8 & 0xffffffff;
      lVar25 = uVar10 << 4;
      do {
        uVar28 = *(ulong *)((long)__ptr_01 + lVar25 + -0x10);
        uVar10 = (ulong)*(uint *)((long)__ptr_01 + lVar25 + -8);
        uVar23 = (uint)(uVar28 >> 0x20);
        if (uVar10 < uVar8) {
          uVar22 = *(ushort *)
                    ((long)pvVar1 + (((uint)(uVar28 << 0x15) | uVar23 >> 0xb) * uVar6 >> 0x20) * 2);
LAB_00102f9b:
          uVar23 = (uint)(uVar28 >> 0x16);
          pvVar24 = (void *)((long)__ptr + uVar8 * 4);
        }
        else {
          uVar22 = *(ushort *)((long)__ptr + ((uVar28 & 0xffffffff) * uVar6 >> 0x20) * 2);
          if (uVar10 < uVar8 * 2) goto LAB_00102f9b;
          uVar23 = (uint)(uVar28 << 0x15) | uVar23 >> 0xb;
          pvVar24 = pvVar1;
        }
        *(ushort *)((long)__ptr + uVar10 * 2) =
             (ushort)(uVar28 >> 0x20) ^ (ushort)uVar28 ^
             uVar22 ^ *(ushort *)((long)pvVar24 + (uVar23 * uVar6 >> 0x20) * 2);
        lVar25 = lVar25 + -0x10;
      } while (lVar25 != 0);
    }
    free(__s);
    free(__ptr_00);
    free(__ptr_01);
  }
  free(keys);
  sVar26 = (uVar8 * 3 + 7 >> 3) + 0x10;
  if (uVar8 != 0) {
    lVar25 = 0;
    do {
      if (*(short *)((long)__ptr + lVar25 * 2) != 0) {
        sVar26 = sVar26 + 2;
      }
      lVar25 = lVar25 + 1;
    } while (uVar8 * 3 + (ulong)(uVar8 * 3 == 0) != lVar25);
  }
  sVar27 = uVar8 * 6 + 0x10;
  free(__ptr);
LAB_0010291e:
  sVar33.pack = sVar26;
  sVar33.standard = sVar27;
  return sVar33;
}

Assistant:

sizes xor16(size_t n) {
  xor16_t filter = {0};
  if (! xor16_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = xor16_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = xor16_serialization_bytes(&filter),
    .pack = xor16_pack_bytes(&filter)
  };
  xor16_free(&filter);
  return s;
}